

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::~SimpleHashTable(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                   *this)

{
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar1;
  EntryType *current;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar2;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < this->size; uVar3 = uVar3 + 1) {
    pSVar2 = this->table[uVar3];
    while (pSVar2 != (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0) {
      pSVar1 = pSVar2->next;
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<void*,Memory::Recycler::PinRecord>>
                (this->allocator,pSVar2);
      pSVar2 = pSVar1;
    }
  }
  while (pSVar2 = this->free, pSVar2 != (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0)
  {
    this->free = pSVar2->next;
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<void*,Memory::Recycler::PinRecord>>
              (this->allocator,pSVar2);
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
            (this->allocator,(ulong)this->size,this->table);
  return;
}

Assistant:

~SimpleHashTable()
    {
        for (uint i = 0; i < size; i++)
        {
            EntryType * entry = table[i];
            while (entry != nullptr)
            {
                EntryType * next = entry->next;
                AllocatorDelete(TAllocator, allocator, entry);
                entry = next;
            }
        }

        while(free)
        {
            EntryType* current = free;
            free = current->next;
            AllocatorDelete(TAllocator, allocator, current);
        }
        AllocatorDeleteArray(TAllocator, allocator,  size, table);
    }